

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xml_attribute *ns,xml_node *a,xpath_allocator *p)

{
  xpath_memory_block *pxVar1;
  xpath_memory_block *local_30;
  
  if (this->_test == '\x02') {
    step_push((xpath_ast_node *)0x2,(xpath_node_set_raw *)(this->_data).variable,ns,a,p);
  }
  pxVar1 = p->_root;
  if (pxVar1 != (xpath_memory_block *)0x0) {
    do {
      local_30 = pxVar1;
      step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                (xpath_node_set_raw *)(this->_data).variable,(xml_node *)ns,
                (xpath_allocator *)&local_30);
      pxVar1 = *(xpath_memory_block **)pxVar1->data;
    } while (pxVar1 != (xpath_memory_block *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& p, xpath_allocator* alloc, T v)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self && _test == nodetest_type_node) // reject attributes based on principal node type test
					step_push(ns, a, p, alloc);

				xml_node cur = p;
				
				while (cur)
				{
					step_push(ns, cur, alloc);
					
					cur = cur.parent();
				}
				
				break;
			}

			case axis_descendant_or_self:
			case axis_self:
			{
				if (_test == nodetest_type_node) // reject attributes based on principal node type test
					step_push(ns, a, p, alloc);

				break;
			}

			case axis_following:
			{
				xml_node cur = p;
				
				for (;;)
				{
					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (cur && !cur.next_sibling()) cur = cur.parent();
						cur = cur.next_sibling();
						
						if (!cur) break;
					}

					step_push(ns, cur, alloc);
				}

				break;
			}

			case axis_parent:
			{
				step_push(ns, p, alloc);

				break;
			}

			case axis_preceding:
			{
				// preceding:: axis does not include attribute nodes and attribute ancestors (they are the same as parent's ancestors), so we can reuse node preceding
				step_fill(ns, p, alloc, v);
				break;
			}
			
			default:
				assert(!"Unimplemented axis");
			}
		}